

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * llvm::outs(void)

{
  bool bVar1;
  int iVar2;
  StringRef local_28;
  undefined1 local_18 [8];
  error_code EC;
  
  std::error_code::error_code((error_code *)local_18);
  if (outs()::S == '\0') {
    iVar2 = __cxa_guard_acquire(&outs()::S);
    if (iVar2 != 0) {
      StringRef::StringRef(&local_28,"-");
      raw_fd_ostream::raw_fd_ostream(&outs::S,local_28,(error_code *)local_18,F_None);
      __cxa_atexit(raw_fd_ostream::~raw_fd_ostream,&outs::S,&__dso_handle);
      __cxa_guard_release(&outs()::S);
    }
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!EC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                  ,0x281,"raw_ostream &llvm::outs()");
  }
  return (raw_ostream *)&outs::S;
}

Assistant:

raw_ostream &llvm::outs() {
  // Set buffer settings to model stdout behavior.
  std::error_code EC;
  static raw_fd_ostream S("-", EC, sys::fs::OF_None);
  assert(!EC);
  return S;
}